

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# antispoof.c
# Opt level: O3

void seat_antispoof_msg(InteractionReadySeat iseat,char *msg)

{
  ulong uVar1;
  _Bool _Var2;
  strbuf *buf_o;
  size_t sVar3;
  ptrlen pl;
  ptrlen pl_00;
  
  buf_o = strbuf_new();
  (*(iseat.seat)->vt->set_trust_status)(iseat.seat,true);
  _Var2 = (*(iseat.seat)->vt->can_set_trust_status)(iseat.seat);
  if (_Var2) {
    sVar3 = strlen(msg);
    pl.len = sVar3;
    pl.ptr = msg;
    BinarySink_put_datapl(buf_o->binarysink_,pl);
  }
  else if (*msg != '\0') {
    BinarySink_put_fmt(buf_o->binarysink_,"-- %s ",msg);
    uVar1 = buf_o->len;
    while (uVar1 < 0x4e) {
      BinarySink_put_byte(buf_o->binarysink_,'-');
      uVar1 = buf_o->len;
    }
  }
  pl_00.len = 2;
  pl_00.ptr = "\r\n";
  BinarySink_put_datapl(buf_o->binarysink_,pl_00);
  (*(iseat.seat)->vt->banner)(iseat.seat,buf_o->u,buf_o->len);
  strbuf_free(buf_o);
  return;
}

Assistant:

void seat_antispoof_msg(InteractionReadySeat iseat, const char *msg)
{
    strbuf *sb = strbuf_new();
    seat_set_trust_status(iseat.seat, true);
    if (seat_can_set_trust_status(iseat.seat)) {
        /*
         * If the seat can directly indicate that this message is
         * generated by the client, then we can just use the message
         * unmodified as an unspoofable header.
         */
        put_dataz(sb, msg);
    } else if (*msg) {
        /*
         * Otherwise, add enough padding around it that the server
         * wouldn't be able to mimic it within our line-length
         * constraint.
         */
        put_fmt(sb, "-- %s ", msg);
        while (sb->len < 78)
            put_byte(sb, '-');
    }
    put_datapl(sb, PTRLEN_LITERAL("\r\n"));
    seat_banner_pl(iseat, ptrlen_from_strbuf(sb));
    strbuf_free(sb);
}